

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

string_t duckdb::NumericHelper::FormatSigned<long>(long value,Vector *vector)

{
  uint64_t value_00;
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  idx_t len;
  undefined1 *puVar5;
  Vector *vector_00;
  string_t result;
  undefined1 local_30 [16];
  
  bVar1 = -(char)(value >> 0x3f);
  value_00 = (ulong)bVar1 + (value >> 0x3f ^ value);
  iVar2 = UnsignedLength<unsigned_long>(value_00);
  vector_00 = (Vector *)(long)(int)(iVar2 + (uint)bVar1);
  local_30 = (undefined1  [16])StringVector::EmptyString((StringVector *)vector,vector_00,len);
  puVar5 = local_30._8_8_;
  if (local_30._0_4_ < 0xd) {
    puVar5 = local_30 + 4;
  }
  pcVar3 = FormatUnsigned<unsigned_long>(value_00,puVar5 + (long)&vector_00->vector_type);
  if (value < 0) {
    pcVar3[-1] = '-';
  }
  uVar4 = (ulong)(uint)local_30._0_4_;
  if (uVar4 < 0xd) {
    switchD_0105b559::default(local_30 + 4 + uVar4,0,0xc - uVar4);
  }
  else {
    local_30._4_4_ = *(undefined4 *)local_30._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_30;
}

Assistant:

static string_t FormatSigned(T value, Vector &vector) {
		typedef typename MakeUnsigned<T>::type unsigned_t;
		int8_t sign = -(value < 0);
		unsigned_t unsigned_value = unsigned_t(value ^ T(sign)) + unsigned_t(AbsValue(sign));
		auto length = UnsafeNumericCast<idx_t>(UnsignedLength<unsigned_t>(unsigned_value) + AbsValue(sign));
		string_t result = StringVector::EmptyString(vector, length);
		auto dataptr = result.GetDataWriteable();
		auto endptr = dataptr + length;
		endptr = FormatUnsigned(unsigned_value, endptr);
		if (sign) {
			*--endptr = '-';
		}
		result.Finalize();
		return result;
	}